

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O2

void __thiscall cpp_sgr::sgr::~sgr(sgr *this)

{
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~sgr() = default;